

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauTree.c
# Opt level: O1

int Dss_ObjCheckTransparent(Dss_Man_t *p,Dss_Obj_t *pObj)

{
  Dss_Obj_t *pObj_00;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  while( true ) {
    uVar1 = *(uint *)&pObj->field_0x4 & 7;
    if (uVar1 != 5) break;
    if (*(uint *)&pObj->field_0x4 < 0x10000000) {
LAB_004abda0:
      __assert_fail("i < (int)pObj->nFans",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauTree.c"
                    ,0x7c,"Dss_Obj_t *Dss_ObjFanin(Vec_Ptr_t *, Dss_Obj_t *, int)");
    }
    if ((int)*(uint *)&pObj[1].field_0x4 < 0) goto LAB_004abd81;
    uVar1 = *(uint *)&pObj[1].field_0x4 >> 1;
    if (p->vObjs->nSize <= (int)uVar1) goto LAB_004abd62;
    iVar2 = Dss_ObjCheckTransparent(p,(Dss_Obj_t *)p->vObjs->pArray[uVar1]);
    if (iVar2 == 0) goto switchD_004abcfd_caseD_3;
    if (*(uint *)&pObj->field_0x4 < 0x18000000) goto LAB_004abda0;
    if ((int)pObj[2].Id < 0) goto LAB_004abd81;
    uVar1 = pObj[2].Id >> 1;
    if (p->vObjs->nSize <= (int)uVar1) goto LAB_004abd62;
    pObj = (Dss_Obj_t *)p->vObjs->pArray[uVar1];
  }
  switch(uVar1) {
  case 2:
switchD_004abcfd_caseD_2:
    iVar2 = 1;
    break;
  case 4:
    if (0x7ffffff < *(uint *)&pObj->field_0x4) {
      uVar3 = 0;
      do {
        if ((int)(&pObj[1].Id)[uVar3] < 0) {
LAB_004abd81:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        uVar1 = (&pObj[1].Id)[uVar3] >> 1;
        if (p->vObjs->nSize <= (int)uVar1) {
LAB_004abd62:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pObj_00 = (Dss_Obj_t *)p->vObjs->pArray[uVar1];
        if (pObj_00 == (Dss_Obj_t *)0x0) {
          return 0;
        }
        iVar2 = Dss_ObjCheckTransparent(p,pObj_00);
        if (iVar2 != 0) goto switchD_004abcfd_caseD_2;
        uVar3 = uVar3 + 1;
        if (*(uint *)&pObj->field_0x4 >> 0x1b <= uVar3) {
          return 0;
        }
      } while( true );
    }
  case 3:
  case 6:
switchD_004abcfd_caseD_3:
    iVar2 = 0;
    break;
  default:
    __assert_fail("pObj->Type == DAU_DSD_PRIME",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauTree.c"
                  ,0x709,"int Dss_ObjCheckTransparent(Dss_Man_t *, Dss_Obj_t *)");
  }
  return iVar2;
}

Assistant:

int Dss_ObjCheckTransparent( Dss_Man_t * p, Dss_Obj_t * pObj )
{
    Dss_Obj_t * pFanin;
    int i;
    if ( pObj->Type == DAU_DSD_VAR )
        return 1;
    if ( pObj->Type == DAU_DSD_AND )
        return 0;
    if ( pObj->Type == DAU_DSD_XOR )
    {
        Dss_ObjForEachFanin( p->vObjs, pObj, pFanin, i )
            if ( Dss_ObjCheckTransparent( p, pFanin ) )
                return 1;
        return 0;
    }
    if ( pObj->Type == DAU_DSD_MUX )
    {
        pFanin = Dss_ObjFanin( p->vObjs, pObj, 1 );
        if ( !Dss_ObjCheckTransparent(p, pFanin) )
            return 0;
        pFanin = Dss_ObjFanin( p->vObjs, pObj, 2 );
        if ( !Dss_ObjCheckTransparent(p, pFanin) )
            return 0;
        return 1;
    }
    assert( pObj->Type == DAU_DSD_PRIME );
    return 0;
}